

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str)

{
  CaseSensitive in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  AssertionHandler *in_stack_ffffffffffffffc0;
  
  Matchers::Equals(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  handleExceptionMatchExpr(in_stack_ffffffffffffffc0,(StringMatcher *)in_stack_ffffffffffffffb8);
  Matchers::StringEqualsMatcher::~StringEqualsMatcher((StringEqualsMatcher *)0x185038);
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, std::string const& str ) {
        handleExceptionMatchExpr( handler, Matchers::Equals( str ) );
    }